

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)23>_> *
vkt::tessellation::makeFramebuffer
          (Move<vk::Handle<(vk::HandleType)23>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkRenderPass renderPass,VkImageView colorAttachment,deUint32 width,
          deUint32 height,deUint32 layers)

{
  VkImageView local_50;
  VkFramebufferCreateInfo local_48;
  
  local_48.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  local_48.pNext = (void *)0x0;
  local_48.pAttachments = &local_50;
  local_48.flags = 0;
  local_48.attachmentCount = 1;
  local_48.height = height;
  local_48.layers = layers;
  local_50.m_internal = colorAttachment.m_internal;
  local_48.renderPass.m_internal = renderPass.m_internal;
  local_48.width = width;
  ::vk::createFramebuffer(__return_storage_ptr__,vk,device,&local_48,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkFramebuffer> makeFramebuffer (const DeviceInterface&		vk,
									 const VkDevice				device,
									 const VkRenderPass			renderPass,
									 const VkImageView			colorAttachment,
									 const deUint32				width,
									 const deUint32				height,
									 const deUint32				layers)
{
	const VkFramebufferCreateInfo framebufferInfo = {
		VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,										// const void*                                 pNext;
		(VkFramebufferCreateFlags)0,					// VkFramebufferCreateFlags                    flags;
		renderPass,										// VkRenderPass                                renderPass;
		1u,												// uint32_t                                    attachmentCount;
		&colorAttachment,								// const VkImageView*                          pAttachments;
		width,											// uint32_t                                    width;
		height,											// uint32_t                                    height;
		layers,											// uint32_t                                    layers;
	};

	return createFramebuffer(vk, device, &framebufferInfo);
}